

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fitsphere.cpp
# Opt level: O1

float computeBoundingSphere(uint vcount,float *points,float *center)

{
  float fVar1;
  bool bVar2;
  bool bVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  bool bVar7;
  bool bVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  float fVar19;
  float fVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [64];
  undefined1 extraout_var [60];
  float fVar25;
  undefined1 auVar26 [64];
  undefined1 auVar27 [64];
  float fVar28;
  undefined1 auVar29 [64];
  undefined1 auVar30 [64];
  undefined1 auVar31 [64];
  float fVar32;
  undefined1 auVar33 [64];
  undefined1 auVar34 [16];
  undefined1 auVar35 [64];
  undefined1 auVar36 [16];
  undefined1 auVar37 [64];
  undefined1 auVar38 [64];
  undefined1 auVar39 [16];
  undefined1 auVar40 [64];
  undefined1 auVar41 [16];
  undefined1 auVar42 [64];
  
  bVar7 = false;
  bVar8 = vcount == 0;
  if (bVar8) {
    auVar24 = ZEXT464(0xccbebc20);
    auVar26 = ZEXT464(0x4cbebc20);
    auVar23 = auVar26._0_16_;
    auVar29 = ZEXT1664(auVar23);
    auVar21 = auVar24._0_16_;
    auVar27 = ZEXT1664(auVar21);
    auVar33 = ZEXT1664(auVar21);
    auVar9 = auVar23;
    auVar22 = auVar23;
    auVar41 = auVar23;
    auVar36 = auVar21;
    auVar34 = auVar21;
    auVar39 = auVar23;
    auVar11 = auVar23;
    auVar14 = auVar21;
    auVar10 = auVar23;
    auVar12 = auVar21;
    auVar13 = auVar21;
  }
  else {
    uVar6 = (ulong)vcount * 3;
    auVar30 = ZEXT464(0x4cbebc20);
    auVar31 = ZEXT464(0xccbebc20);
    bVar7 = false;
    uVar4 = 0;
    bVar8 = true;
    auVar12 = auVar31._0_16_;
    auVar10 = auVar30._0_16_;
    auVar38 = ZEXT1664(auVar12);
    auVar37 = ZEXT1664(auVar12);
    auVar35 = ZEXT1664(auVar12);
    auVar42 = ZEXT1664(auVar10);
    auVar40 = ZEXT1664(auVar10);
    auVar33 = ZEXT1664(auVar12);
    auVar27 = ZEXT1664(auVar12);
    auVar24 = ZEXT1664(auVar12);
    auVar29 = ZEXT1664(auVar10);
    auVar26 = ZEXT1664(auVar10);
    auVar13 = auVar12;
    do {
      uVar5 = uVar4 & 0xffffffff;
      auVar23 = vucomiss_avx512f(ZEXT416((uint)points[uVar5]));
      if (!bVar7 && !bVar8) {
        auVar29 = ZEXT464((uint)points[uVar5 + 1]);
        auVar26 = ZEXT464((uint)points[uVar5 + 2]);
        auVar23 = ZEXT416((uint)points[uVar5]);
      }
      auVar15 = vucomiss_avx512f(auVar33._0_16_);
      if (!bVar7 && !bVar8) {
        auVar27 = ZEXT464((uint)points[uVar5 + 1]);
        auVar24 = ZEXT464((uint)points[uVar5 + 2]);
        auVar33 = ZEXT1664(auVar15);
      }
      auVar22 = vucomiss_avx512f(ZEXT416((uint)points[uVar5 + 1]));
      if (!bVar7 && !bVar8) {
        auVar40 = ZEXT464((uint)points[uVar5 + 2]);
        auVar42 = ZEXT1664(auVar15);
        auVar22 = ZEXT416((uint)points[uVar5 + 1]);
      }
      auVar39 = auVar40._0_16_;
      auVar41 = auVar42._0_16_;
      auVar14 = vucomiss_avx512f(auVar37._0_16_);
      if (!bVar7 && !bVar8) {
        auVar35 = ZEXT464((uint)points[uVar5 + 2]);
        auVar37 = ZEXT1664(auVar14);
        auVar38 = ZEXT1664(auVar15);
      }
      auVar34 = auVar35._0_16_;
      auVar36 = auVar37._0_16_;
      auVar21 = auVar38._0_16_;
      auVar9 = vucomiss_avx512f(ZEXT416((uint)points[uVar5 + 2]));
      bVar2 = !bVar7;
      bVar3 = !bVar8;
      auVar9 = vminss_avx512f(ZEXT416((uint)points[uVar5 + 2]),auVar9);
      auVar10._0_4_ =
           (uint)(bVar2 && bVar3) * auVar14._0_4_ + (uint)(!bVar2 || !bVar3) * auVar10._0_4_;
      auVar11._4_12_ = auVar30._4_12_;
      auVar11._0_4_ =
           (uint)(bVar2 && bVar3) * auVar15._0_4_ + (uint)(!bVar2 || !bVar3) * auVar30._0_4_;
      auVar30 = ZEXT1664(auVar11);
      auVar16 = vucomiss_avx512f(auVar12);
      bVar7 = !bVar7;
      bVar8 = !bVar8;
      auVar12 = vmaxss_avx512f(auVar16,auVar12);
      auVar13._0_4_ =
           (uint)(bVar7 && bVar8) * auVar14._0_4_ + (uint)(!bVar7 || !bVar8) * auVar13._0_4_;
      auVar14._4_12_ = auVar31._4_12_;
      auVar14._0_4_ =
           (uint)(bVar7 && bVar8) * auVar15._0_4_ + (uint)(!bVar7 || !bVar8) * auVar31._0_4_;
      auVar31 = ZEXT1664(auVar14);
      uVar4 = uVar4 + 3;
      bVar7 = uVar6 < uVar4;
      bVar8 = uVar6 == uVar4;
    } while (!bVar8);
  }
  auVar15 = vsubss_avx512f(auVar33._0_16_,auVar23);
  auVar16 = vsubss_avx512f(auVar27._0_16_,auVar29._0_16_);
  auVar17 = vsubss_avx512f(auVar24._0_16_,auVar26._0_16_);
  auVar16 = vmulss_avx512f(auVar16,auVar16);
  auVar15 = vfmadd231ss_avx512f(auVar16,auVar15,auVar15);
  auVar16 = vfmadd231ss_avx512f(auVar15,auVar17,auVar17);
  auVar15 = vsubss_avx512f(auVar21,auVar41);
  auVar17 = vsubss_avx512f(auVar36,auVar22);
  auVar18 = vsubss_avx512f(auVar34,auVar39);
  auVar17 = vmulss_avx512f(auVar17,auVar17);
  auVar15 = vfmadd231ss_avx512f(auVar17,auVar15,auVar15);
  vfmadd231ss_avx512f(auVar15,auVar18,auVar18);
  auVar15 = vsubss_avx512f(auVar14,auVar11);
  auVar17 = vsubss_avx512f(auVar13,auVar10);
  auVar18 = vsubss_avx512f(auVar12,auVar9);
  auVar17 = vmulss_avx512f(auVar17,auVar17);
  auVar15 = vfmadd231ss_avx512f(auVar17,auVar15,auVar15);
  vfmadd231ss_avx512f(auVar15,auVar18,auVar18);
  auVar15 = vucomiss_avx512f(auVar16);
  if (!bVar7 && !bVar8) {
    auVar26 = ZEXT1664(auVar39);
    auVar29 = ZEXT1664(auVar22);
    auVar24 = ZEXT1664(auVar34);
    auVar27 = ZEXT1664(auVar36);
    auVar33 = ZEXT1664(auVar21);
    auVar16 = auVar15;
    auVar23 = auVar41;
  }
  fVar25 = auVar26._0_4_;
  fVar19 = auVar24._0_4_;
  fVar28 = auVar29._0_4_;
  fVar20 = auVar27._0_4_;
  fVar32 = auVar33._0_4_;
  vucomiss_avx512f(auVar16);
  if (!bVar7 && !bVar8) {
    fVar25 = auVar9._0_4_;
    fVar28 = auVar10._0_4_;
    fVar19 = auVar12._0_4_;
    fVar20 = auVar13._0_4_;
    fVar32 = auVar14._0_4_;
    auVar23 = auVar11;
  }
  fVar1 = (auVar23._0_4_ + fVar32) * 0.5;
  *center = fVar1;
  fVar28 = (fVar28 + fVar20) * 0.5;
  center[1] = fVar28;
  fVar25 = (fVar25 + fVar19) * 0.5;
  center[2] = fVar25;
  fVar20 = fVar20 - fVar28;
  auVar23 = ZEXT416((uint)(fVar32 - fVar1));
  auVar23 = vfmadd231ss_fma(ZEXT416((uint)(fVar20 * fVar20)),auVar23,auVar23);
  auVar22 = ZEXT416((uint)(fVar19 - fVar25));
  auVar23 = vfmadd231ss_fma(auVar23,auVar22,auVar22);
  auVar24 = ZEXT1664(auVar23);
  fVar20 = auVar23._0_4_;
  if (fVar20 < 0.0) {
    auVar26._0_4_ = sqrtf(fVar20);
    auVar26._4_60_ = extraout_var;
    auVar24 = ZEXT464((uint)fVar20);
    auVar23 = auVar26._0_16_;
  }
  else {
    auVar23 = vsqrtss_avx(auVar23,auVar23);
  }
  fVar20 = auVar23._0_4_;
  auVar26 = ZEXT1664(auVar23);
  if (vcount != 0) {
    uVar6 = 0;
    do {
      uVar4 = uVar6 & 0xffffffff;
      auVar23 = vfmadd231ss_fma(ZEXT416((uint)((points[uVar4 + 1] - center[1]) *
                                              (points[uVar4 + 1] - center[1]))),
                                ZEXT416((uint)(points[uVar4] - *center)),
                                ZEXT416((uint)(points[uVar4] - *center)));
      auVar23 = vfmadd231ss_fma(auVar23,ZEXT416((uint)(points[uVar4 + 2] - center[2])),
                                ZEXT416((uint)(points[uVar4 + 2] - center[2])));
      fVar20 = auVar23._0_4_;
      if (auVar24._0_4_ < fVar20) {
        if (fVar20 < 0.0) {
          fVar20 = sqrtf(fVar20);
        }
        else {
          auVar23 = vsqrtss_avx(auVar23,auVar23);
          fVar20 = auVar23._0_4_;
        }
        fVar19 = (auVar26._0_4_ + fVar20) * 0.5;
        auVar26 = ZEXT464((uint)fVar19);
        auVar24 = ZEXT464((uint)(fVar19 * fVar19));
        fVar25 = fVar20 - fVar19;
        fVar20 = 1.0 / fVar20;
        auVar9 = ZEXT416((uint)fVar19);
        auVar23 = vfmadd231ss_fma(ZEXT416((uint)(fVar25 * points[uVar4])),auVar9,
                                  ZEXT416((uint)*center));
        auVar22 = vfmadd231ss_fma(ZEXT416((uint)(fVar25 * points[uVar4 + 1])),auVar9,
                                  ZEXT416((uint)center[1]));
        auVar9 = vfmadd231ss_fma(ZEXT416((uint)(fVar25 * points[uVar4 + 2])),auVar9,
                                 ZEXT416((uint)center[2]));
        *center = fVar20 * auVar23._0_4_;
        center[1] = fVar20 * auVar22._0_4_;
        center[2] = fVar20 * auVar9._0_4_;
      }
      fVar20 = auVar26._0_4_;
      uVar6 = uVar6 + 3;
    } while ((ulong)vcount * 3 != uVar6);
  }
  return fVar20;
}

Assistant:

float computeBoundingSphere(unsigned int vcount,const float *points,float *center)
{

  float mRadius;
  float mRadius2;

	float xmin[3];
	float xmax[3];
	float ymin[3];
	float ymax[3];
	float zmin[3];
	float zmax[3];
	float dia1[3];
	float dia2[3];

  /* FIRST PASS: find 6 minima/maxima points */
  Set(xmin,BIGNUMBER,BIGNUMBER,BIGNUMBER);
  Set(xmax,-BIGNUMBER,-BIGNUMBER,-BIGNUMBER);
  Set(ymin,BIGNUMBER,BIGNUMBER,BIGNUMBER);
  Set(ymax,-BIGNUMBER,-BIGNUMBER,-BIGNUMBER);
  Set(zmin,BIGNUMBER,BIGNUMBER,BIGNUMBER);
  Set(zmax,-BIGNUMBER,-BIGNUMBER,-BIGNUMBER);

  for (unsigned i=0; i<vcount; i++)
	{
		const float *caller_p = &points[i*3];

   	if (caller_p[0]<xmin[0])
  	  Copy(xmin,caller_p); /* New xminimum point */
  	if (caller_p[0]>xmax[0])
  	  Copy(xmax,caller_p);
  	if (caller_p[1]<ymin[1])
  	  Copy(ymin,caller_p);
  	if (caller_p[1]>ymax[1])
  	  Copy(ymax,caller_p);
  	if (caller_p[2]<zmin[2])
  	  Copy(zmin,caller_p);
  	if (caller_p[2]>zmax[2])
  	  Copy(zmax,caller_p);
	}

  /* Set xspan = distance between the 2 points xmin & xmax (squared) */
  float dx = xmax[0] - xmin[0];
  float dy = xmax[1] - xmin[1];
  float dz = xmax[2] - xmin[2];
  float xspan = dx*dx + dy*dy + dz*dz;

  /* Same for y & z spans */
  dx = ymax[0] - ymin[0];
  dy = ymax[1] - ymin[1];
  dz = ymax[2] - ymin[2];
  float yspan = dx*dx + dy*dy + dz*dz;

  dx = zmax[0] - zmin[0];
  dy = zmax[1] - zmin[1];
  dz = zmax[2] - zmin[2];
  float zspan = dx*dx + dy*dy + dz*dz;

  /* Set points dia1 & dia2 to the maximally separated pair */
  Copy(dia1,xmin);
  Copy(dia2,xmax); /* assume xspan biggest */
  float maxspan = xspan;

  if (yspan>maxspan)
	{
	  maxspan = yspan;
  	Copy(dia1,ymin);
  	Copy(dia2,ymax);
	}

  if (zspan>maxspan)
	{
	  Copy(dia1,zmin);
	  Copy(dia2,zmax);
	}


  /* dia1,dia2 is a diameter of initial sphere */
  /* calc initial center */
  center[0] = (dia1[0]+dia2[0])*0.5f;
  center[1] = (dia1[1]+dia2[1])*0.5f;
  center[2] = (dia1[2]+dia2[2])*0.5f;

  /* calculate initial radius**2 and radius */

  dx = dia2[0]-center[0]; /* x component of radius vector */
  dy = dia2[1]-center[1]; /* y component of radius vector */
  dz = dia2[2]-center[2]; /* z component of radius vector */

  mRadius2 = dx*dx + dy*dy + dz*dz;
  mRadius = float(sqrt(mRadius2));

  /* SECOND PASS: increment current sphere */

	if ( 1 )
	{
		for (unsigned i=0; i<vcount; i++)
		{
			const float *caller_p = &points[i*3];

  		dx = caller_p[0]-center[0];
			dy = caller_p[1]-center[1];
  		dz = caller_p[2]-center[2];

			float old_to_p_sq = dx*dx + dy*dy + dz*dz;

  		if (old_to_p_sq > mRadius2) 	/* do r**2 test first */
			{ 	/* this point is outside of current sphere */
	  		float old_to_p = float(sqrt(old_to_p_sq));
				/* calc radius of new sphere */
  			mRadius = (mRadius + old_to_p) * 0.5f;
	  		mRadius2 = mRadius*mRadius; 	/* for next r**2 compare */
  			float old_to_new = old_to_p - mRadius;

	  		/* calc center of new sphere */

				float recip = 1.0f /old_to_p;

  			float cx = (mRadius*center[0] + old_to_new*caller_p[0]) * recip;
	  		float cy = (mRadius*center[1] + old_to_new*caller_p[1]) * recip;
				float cz = (mRadius*center[2] + old_to_new*caller_p[2]) * recip;

				Set(center,cx,cy,cz);
			}
		}
	}

  return mRadius;
}